

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O3

bool __thiscall
Diligent::DearchiverBase::LoadArchive
          (DearchiverBase *this,IDataBlob *pArchiveData,Uint32 ContentVersion,bool MakeCopy)

{
  undefined4 uVar1;
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined1 uVar2;
  bool bVar3;
  ArchiveData *Archive;
  pointer pAVar4;
  DeviceObjectArchive *this_01;
  undefined7 extraout_var;
  const_iterator cVar5;
  pointer *__ptr;
  char (*in_R8) [33];
  _Hash_node_base *p_Var6;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>,_bool>
  pVar7;
  string _msg;
  char *ResName;
  size_t ArchiveIdx;
  _Head_base<0UL,_Diligent::DeviceObjectArchive_*,_false> local_78;
  undefined1 local_70 [12];
  bool bStack_64;
  undefined3 uStack_63;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined4 local_4c;
  vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
  *local_48;
  _Hash_node_base *local_40;
  long local_38;
  
  if (pArchiveData == (IDataBlob *)0x0) {
    uVar2 = 0;
  }
  else {
    for (pAVar4 = (this->m_Archives).
                  super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar4 != (this->m_Archives).
                  super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pAVar4 = pAVar4 + 1) {
      if ((((pAVar4->pObjArchive)._M_t.
            super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
            .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl)->
          m_pArchiveData).m_pObject == pArchiveData) {
        return true;
      }
    }
    this_01 = (DeviceObjectArchive *)operator_new(0xf0);
    DeviceObjectArchive::DeviceObjectArchive(this_01,0);
    bStack_64 = MakeCopy;
    local_78._M_head_impl = this_01;
    local_70._0_8_ = pArchiveData;
    local_70._8_4_ = ContentVersion;
    uVar2 = DeviceObjectArchive::Deserialize(this_01,(CreateInfo *)local_70);
    if ((bool)uVar2) {
      local_4c = (undefined4)CONCAT71(extraout_var,uVar2);
      local_48 = (vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
                  *)&this->m_Archives;
      local_38 = ((long)(this->m_Archives).
                        super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_Archives).
                        super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7dc11f7047dc11f7;
      p_Var6 = ((local_78._M_head_impl)->m_NamedResources)._M_h._M_before_begin._M_nxt;
      if (p_Var6 != (_Hash_node_base *)0x0) {
        do {
          uVar1 = *(undefined4 *)&p_Var6[1]._M_nxt;
          local_40 = p_Var6[2]._M_nxt;
          local_70._0_4_ = uVar1;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)(local_70 + 8),(Char *)local_40,true);
          pVar7 = std::
                  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,unsigned_long_const&>
                            ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)&this->m_ResNameToArchiveIdx,(string *)local_70,&local_38);
          if (((void *)CONCAT44(_bStack_64,local_70._8_4_) != (void *)0x0) &&
             ((long)local_60._M_allocated_capacity < 0)) {
            operator_delete__((void *)CONCAT44(_bStack_64,local_70._8_4_));
          }
          if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            this_00 = *(_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        **)(*(long *)local_48 +
                           *(long *)((long)pVar7.first.
                                           super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                                           ._M_cur.
                                           super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                                    + 0x20) * 0x1c8);
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)(local_70 + 8),(Char *)local_40,false);
            cVar5 = std::
                    _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,(key_type *)local_70);
            if (((void *)CONCAT44(_bStack_64,local_70._8_4_) != (void *)0x0) &&
               ((long)local_60._M_allocated_capacity < 0)) {
              operator_delete__((void *)CONCAT44(_bStack_64,local_70._8_4_));
            }
            if ((cVar5.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                 ._M_cur == (__node_type *)0x0) ||
               (bVar3 = DeviceObjectArchive::ResourceData::operator==
                                  ((ResourceData *)(p_Var6 + 4),
                                   (ResourceData *)
                                   ((long)cVar5.
                                          super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                          ._M_cur + 0x20)), !bVar3)) {
              FormatString<char[21],char_const*,char[33]>
                        ((string *)local_70,(Diligent *)"Resource with name \'",
                         (char (*) [21])&local_40,(char **)"\' already exists in the archive.",in_R8
                        );
              if (DebugMessageCallback != (undefined *)0x0) {
                in_R8 = (char (*) [33])0x0;
                (*(code *)DebugMessageCallback)(2,local_70._0_8_,0,0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._0_8_ != &local_60) {
                operator_delete((void *)local_70._0_8_,local_60._M_allocated_capacity + 1);
              }
            }
          }
          p_Var6 = p_Var6->_M_nxt;
        } while (p_Var6 != (_Hash_node_base *)0x0);
      }
      std::
      vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
      ::
      emplace_back<std::unique_ptr<Diligent::DeviceObjectArchive,std::default_delete<Diligent::DeviceObjectArchive>>>
                (local_48,(unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
                           *)&local_78);
      uVar2 = (undefined1)local_4c;
    }
    if (local_78._M_head_impl != (DeviceObjectArchive *)0x0) {
      std::default_delete<Diligent::DeviceObjectArchive>::operator()
                ((default_delete<Diligent::DeviceObjectArchive> *)&local_78,local_78._M_head_impl);
    }
  }
  return (bool)uVar2;
}

Assistant:

bool DearchiverBase::LoadArchive(const IDataBlob* pArchiveData, Uint32 ContentVersion, bool MakeCopy)
{
    if (pArchiveData == nullptr)
        return false;

    for (const ArchiveData& Archive : m_Archives)
    {
        if (Archive.pObjArchive->GetData() == pArchiveData)
        {
            // The archive is already loaded
            return true;
        }
    }

    std::unique_ptr<DeviceObjectArchive> pObjArchive = std::make_unique<DeviceObjectArchive>();
    if (!pObjArchive->Deserialize(DeviceObjectArchive::CreateInfo{pArchiveData, ContentVersion, MakeCopy}))
        return false;

    const size_t ArchiveIdx = m_Archives.size();

    const auto& ArchiveResources = pObjArchive->GetNamedResources();
    for (const auto& it : ArchiveResources)
    {
        const ResourceType ResType      = it.first.GetType();
        const char*        ResName      = it.first.GetName();
        constexpr bool     MakeNameCopy = true;

        const auto it_inserted = m_ResNameToArchiveIdx.emplace(NamedResourceKey{ResType, ResName, MakeNameCopy}, ArchiveIdx);
        if (!it_inserted.second)
        {
            const auto& OtherArchiveResources = m_Archives[it_inserted.first->second].pObjArchive->GetNamedResources();
            const auto  it_other              = OtherArchiveResources.find(NamedResourceKey{ResType, ResName});

            const bool IsDuplicate =
                (it_other != OtherArchiveResources.end()) &&
                (it.second == it_other->second);
            if (!IsDuplicate)
            {
                LOG_ERROR_MESSAGE("Resource with name '", ResName, "' already exists in the archive.");
            }
        }
    }

    m_Archives.emplace_back(std::move(pObjArchive));

    return true;
}